

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::proximate(path *__return_storage_ptr__,path *p,error_code *ec)

{
  path cp;
  path pStack_38;
  
  current_path(&pStack_38,ec);
  if (ec->_M_value == 0) {
    proximate(__return_storage_ptr__,p,&pStack_38,ec);
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&pStack_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path proximate(const path& p, std::error_code& ec)
{
    auto cp = current_path(ec);
    if (!ec) {
        return proximate(p, cp, ec);
    }
    return path();
}